

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  string *psVar1;
  string pfile;
  string home;
  string local_b0;
  string local_90;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::__cxx11::string::string((string *)&local_90,(string *)psVar1);
  local_40.View_._M_len = local_90._M_string_length;
  local_40.View_._M_str = local_90._M_dataplus._M_p;
  local_70.View_._M_len = 0x1f;
  local_70.View_._M_str = "/CMakeFiles/CMakeRuleHashes.txt";
  cmStrCat<>(&local_b0,&local_40,&local_70);
  CheckRuleHashes(this,&local_b0,&local_90);
  WriteRuleHashes(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = cmStrCat(home, "/CMakeFiles/CMakeRuleHashes.txt");
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
#endif
}